

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,Repeat<char> *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,CappedArray<char,_14UL> *rest_2,
                 ArrayPtr<const_char> *rest_3,StringPtr *rest_4,ArrayPtr<const_char> *rest_5,
                 ArrayPtr<const_char> *rest_6,FixedArray<char,_1UL> *rest_7)

{
  bool bVar1;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_00;
  CappedArray<char,_14UL> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  StringPtr *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  FixedArray<char,_1UL> *rest_6_00;
  char *pcVar2;
  Iterator IVar3;
  Iterator local_68;
  undefined1 local_58 [8];
  Iterator end;
  Iterator i;
  ArrayPtr<const_char> *rest_local_3;
  CappedArray<char,_14UL> *rest_local_2;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  Repeat<char> *first_local;
  char *target_local;
  
  IVar3 = Repeat<char>::begin(first);
  end.index._0_1_ = IVar3.value;
  IVar3 = Repeat<char>::end(first);
  end._0_8_ = IVar3.index;
  local_58[0] = IVar3.value;
  first_local = (Repeat<char> *)target;
  while( true ) {
    bVar1 = Repeat<char>::Iterator::operator==((Iterator *)&end.index,(Iterator *)local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IVar3 = Repeat<char>::Iterator::operator++((Iterator *)&end.index,0);
    local_68.index = IVar3.index;
    local_68.value = IVar3.value;
    pcVar2 = Repeat<char>::Iterator::operator*(&local_68);
    first_local->value = *pcVar2;
    first_local = (Repeat<char> *)&first_local->field_0x1;
  }
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_00 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::CappedArray<char,14ul>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::StringPtr>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::FixedArray<char,1ul>>(rest_7);
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                     (&first_local->value,first_00,rest_00,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
                      rest_5_00,rest_6_00);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}